

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

double __thiscall tetgenmesh::incircle3d(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  ulong uVar1;
  double dVar2;
  tetgenmesh *this_00;
  undefined4 uVar3;
  undefined4 uVar4;
  double r;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double c [3];
  double n2 [3];
  double n1 [3];
  
  facenormal(this,pa,pb,pc,n1,1,(double *)0x0);
  local_a8 = n1[0];
  dStack_a0 = n1[1];
  local_b8 = n1[1];
  dStack_b0 = n1[2];
  local_98 = n1[2];
  uStack_90 = 0;
  this_00 = this;
  facenormal(this,pb,pa,pd,n2,1,(double *)0x0);
  dVar2 = n2[2] * n2[2] + n2[0] * n2[0] + n2[1] * n2[1];
  if (local_98 * local_98 + local_a8 * local_a8 + local_b8 * local_b8 <= dVar2) {
    uVar3 = 0;
    uVar4 = 0;
    if (dVar2 <= 0.0) goto LAB_00110b87;
    circumsphere(this_00,pb,pa,pd,(double *)0x0,c,&r);
    pd = pc;
  }
  else {
    circumsphere(this_00,pa,pb,pc,(double *)0x0,c,&r);
  }
  dVar2 = distance(this,c,pd);
  uVar1 = ~-(ulong)(ABS(dVar2 - r) / r < this->b->epsilon) & (ulong)(dVar2 - r);
  uVar3 = (undefined4)uVar1;
  uVar4 = (undefined4)(uVar1 >> 0x20);
LAB_00110b87:
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

REAL tetgenmesh::incircle3d(point pa, point pb, point pc, point pd)
{
  REAL area2[2], n1[3], n2[3], c[3];
  REAL sign, r, d;

  // Calculate the areas of the two triangles [a, b, c] and [b, a, d].
  facenormal(pa, pb, pc, n1, 1, NULL);
  area2[0] = dot(n1, n1);
  facenormal(pb, pa, pd, n2, 1, NULL);
  area2[1] = dot(n2, n2);

  if (area2[0] > area2[1]) {
    // Choose [a, b, c] as the base triangle.
    circumsphere(pa, pb, pc, NULL, c, &r);
    d = distance(c, pd);
  } else {
    // Choose [b, a, d] as the base triangle.
    if (area2[1] > 0) {
      circumsphere(pb, pa, pd, NULL, c, &r);
      d = distance(c, pc);
    } else {
      // The four points are collinear. This case only happens on the boundary.
      return 0; // Return "not inside".
    }
  }

  sign = d - r;
  if (fabs(sign) / r < b->epsilon) {
    sign = 0;
  }

  return sign;
}